

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_textbox_raw(mu_Context *ctx,char *buf,int bufsz,mu_Id id,mu_Rect r,int opt)

{
  mu_Color color;
  mu_Font font;
  uint uVar1;
  mu_Id mVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  mu_Vec2 pos;
  int iVar8;
  mu_Rect rect;
  int local_38;
  
  mu_update_control(ctx,id,r,opt | 0x100);
  mVar2 = ctx->focus;
  uVar7 = 0;
  if (mVar2 == id) {
    sVar4 = strlen(buf);
    uVar6 = (uint)sVar4;
    sVar4 = strlen(ctx->input_text);
    uVar7 = ~uVar6 + bufsz;
    if ((int)(uint)sVar4 <= (int)(~uVar6 + bufsz)) {
      uVar7 = (uint)sVar4;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    else {
      memcpy(buf + (int)uVar6,ctx->input_text,(ulong)uVar7);
      uVar6 = uVar6 + uVar7;
      buf[(int)uVar6] = '\0';
      uVar7 = 4;
    }
    uVar1 = ctx->key_pressed;
    if (0 < (int)uVar6 && (uVar1 & 8) != 0) {
      buf[uVar6 - 1] = '\0';
      uVar1 = ctx->key_pressed;
      uVar7 = 4;
    }
    if ((uVar1 & 0x10) == 0) {
      mVar2 = ctx->focus;
    }
    else {
      ctx->focus = 0;
      ctx->updated_focus = 1;
      uVar7 = uVar7 | 2;
      mVar2 = 0;
    }
  }
  if ((opt & 8U) == 0) {
    iVar5 = 0xb;
    if (mVar2 != id) {
      iVar5 = (ctx->hover == id) + 9;
    }
    (*ctx->draw_frame)(ctx,r,iVar5);
    mVar2 = ctx->focus;
  }
  if (mVar2 == id) {
    color = ctx->style->colors[0];
    font = ctx->style->font;
    iVar3 = (*ctx->text_width)(font,buf,-1,ctx->user_data);
    uVar6 = (*ctx->text_height)(font);
    iVar5 = ctx->style->padding;
    iVar8 = ~(iVar5 + iVar3) + r.w;
    if (iVar5 <= iVar8) {
      iVar8 = iVar5;
    }
    iVar8 = iVar8 + r.x;
    local_38 = r.y;
    local_38 = (int)(r.h - uVar6) / 2 + local_38;
    mu_push_clip_rect(ctx,r);
    pos.y = local_38;
    pos.x = iVar8;
    mu_draw_text(ctx,font,buf,-1,pos,color);
    rect.y = local_38;
    rect.x = iVar8 + iVar3;
    rect._8_8_ = ((ulong)uVar6 << 0x20) + 1;
    mu_draw_rect(ctx,rect,color);
    mu_pop_clip_rect(ctx);
  }
  else {
    mu_draw_control_text(ctx,buf,r,0,opt);
  }
  return uVar7;
}

Assistant:

int mu_textbox_raw(mu_Context *ctx, char *buf, int bufsz, mu_Id id, mu_Rect r,
  int opt)
{
  int res = 0;
  mu_update_control(ctx, id, r, opt | MU_OPT_HOLDFOCUS);

  if (ctx->focus == id) {
    /* handle text input */
    int len = strlen(buf);
    int n = mu_min(bufsz - len - 1, (int) strlen(ctx->input_text));
    if (n > 0) {
      memcpy(buf + len, ctx->input_text, n);
      len += n;
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle backspace */
    if (ctx->key_pressed & MU_KEY_BACKSPACE && len > 0) {
      /* skip utf-8 continuation bytes */
      while ((buf[--len] & 0xc0) == 0x80 && len > 0);
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle return */
    if (ctx->key_pressed & MU_KEY_RETURN) {
      mu_set_focus(ctx, 0);
      res |= MU_RES_SUBMIT;
    }
  }

  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BASE, opt);
  if (ctx->focus == id) {
    mu_Color color = ctx->style->colors[MU_COLOR_TEXT];
    mu_Font font = ctx->style->font;
    int textw = ctx->text_width(font, buf, -1, ctx->user_data);
    int texth = ctx->text_height(font);
    int ofx = r.w - ctx->style->padding - textw - 1;
    int textx = r.x + mu_min(ofx, ctx->style->padding);
    int texty = r.y + (r.h - texth) / 2;
    mu_push_clip_rect(ctx, r);
    mu_draw_text(ctx, font, buf, -1, mu_vec2(textx, texty), color);
    mu_draw_rect(ctx, mu_rect(textx + textw, texty, 1, texth), color);
    mu_pop_clip_rect(ctx);
  } else {
    mu_draw_control_text(ctx, buf, r, MU_COLOR_TEXT, opt);
  }

  return res;
}